

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hashtable_unittests.cc
# Opt level: O0

void __thiscall
HashtableAllTest_ResizeAndRehash_Test<google::HashtableInterface_SparseHashSet<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
::TestBody(HashtableAllTest_ResizeAndRehash_Test<google::HashtableInterface_SparseHashSet<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
           *this)

{
  bool bVar1;
  AssertHelper *this_00;
  char *file;
  AssertHelper *this_01;
  AssertHelper *this_02;
  AssertionResult gtest_ar_2;
  int i_1;
  AssertionResult gtest_ar_1;
  AssertionResult gtest_ar;
  int i;
  TypeParam ht;
  undefined4 in_stack_fffffffffffffd58;
  float in_stack_fffffffffffffd5c;
  HashtableTest<google::HashtableInterface_SparseHashSet<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
  *in_stack_fffffffffffffd60;
  key_equal *in_stack_fffffffffffffd68;
  hasher *in_stack_fffffffffffffd70;
  char *in_stack_fffffffffffffd78;
  int line;
  HashtableInterface_SparseHashSet<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
  *in_stack_fffffffffffffd80;
  char *in_stack_fffffffffffffd88;
  Type type;
  undefined4 in_stack_fffffffffffffdd8;
  undefined4 in_stack_fffffffffffffddc;
  AssertHelper *in_stack_fffffffffffffde0;
  AssertionResult local_218 [6];
  hasher *local_1b0;
  int local_1a4;
  char *local_190;
  undefined4 local_184;
  AssertionResult local_180;
  value_type *in_stack_fffffffffffffe98;
  undefined4 in_stack_fffffffffffffea0;
  undefined4 in_stack_fffffffffffffea4;
  undefined4 uVar2;
  AssertionResult local_150 [6];
  value_type local_e8;
  int local_e0;
  Alloc<const_char_*,_unsigned_long,_18446744073709551615UL> local_d0;
  Hasher local_c0;
  Hasher local_b4 [15];
  
  Hasher::Hasher(local_b4,0);
  Hasher::Hasher(&local_c0,0);
  Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>::Alloc(&local_d0,0,(int *)0x0);
  google::
  HashtableInterface_SparseHashSet<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
  ::HashtableInterface_SparseHashSet
            (in_stack_fffffffffffffd80,(size_type)in_stack_fffffffffffffd78,
             in_stack_fffffffffffffd70,in_stack_fffffffffffffd68,
             (allocator_type *)in_stack_fffffffffffffd60);
  Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>::~Alloc(&local_d0);
  google::
  BaseHashtableInterface<google::sparse_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
  ::max_load_factor((BaseHashtableInterface<google::sparse_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
                     *)in_stack_fffffffffffffd60,in_stack_fffffffffffffd5c);
  for (local_e0 = 1; local_e0 < 100; local_e0 = local_e0 + 1) {
    local_e8 = HashtableTest<google::HashtableInterface_SparseHashSet<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
               ::UniqueObject(in_stack_fffffffffffffd60,(int)in_stack_fffffffffffffd5c);
    google::
    BaseHashtableInterface<google::sparse_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
    ::insert((BaseHashtableInterface<google::sparse_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
              *)CONCAT44(in_stack_fffffffffffffea4,in_stack_fffffffffffffea0),
             in_stack_fffffffffffffe98);
  }
  google::
  BaseHashtableInterface<google::sparse_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
  ::resize((BaseHashtableInterface<google::sparse_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
            *)in_stack_fffffffffffffd60,
           CONCAT44(in_stack_fffffffffffffd5c,in_stack_fffffffffffffd58));
  this_00 = (AssertHelper *)
            google::
            BaseHashtableInterface<google::sparse_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
            ::bucket_count((BaseHashtableInterface<google::sparse_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
                            *)0xcea84a);
  uVar2 = 300;
  testing::internal::CmpHelperLT<unsigned_long,unsigned_int>
            (in_stack_fffffffffffffd78,(char *)in_stack_fffffffffffffd70,
             (unsigned_long *)in_stack_fffffffffffffd68,(uint *)in_stack_fffffffffffffd60);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_150);
  if (!bVar1) {
    testing::Message::Message((Message *)this_00);
    in_stack_fffffffffffffd88 =
         testing::AssertionResult::failure_message((AssertionResult *)0xcea8ca);
    testing::internal::AssertHelper::AssertHelper
              (this_00,(Type)((ulong)in_stack_fffffffffffffd88 >> 0x20),
               (char *)in_stack_fffffffffffffd80,(int)((ulong)in_stack_fffffffffffffd78 >> 0x20),
               (char *)in_stack_fffffffffffffd70);
    testing::internal::AssertHelper::operator=
              (in_stack_fffffffffffffde0,
               (Message *)CONCAT44(in_stack_fffffffffffffddc,in_stack_fffffffffffffdd8));
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffd60);
    testing::Message::~Message((Message *)0xcea927);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xcea998);
  google::
  BaseHashtableInterface<google::sparse_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
  ::rehash((BaseHashtableInterface<google::sparse_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
            *)in_stack_fffffffffffffd60,
           CONCAT44(in_stack_fffffffffffffd5c,in_stack_fffffffffffffd58));
  local_184 = 0x4000;
  file = (char *)google::
                 BaseHashtableInterface<google::sparse_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
                 ::bucket_count((BaseHashtableInterface<google::sparse_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
                                 *)0xcea9c4);
  local_190 = file;
  testing::internal::EqHelper::Compare<unsigned_int,_unsigned_long,_nullptr>
            (in_stack_fffffffffffffd78,(char *)in_stack_fffffffffffffd70,
             (uint *)in_stack_fffffffffffffd68,(unsigned_long *)in_stack_fffffffffffffd60);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_180);
  if (!bVar1) {
    testing::Message::Message((Message *)this_00);
    in_stack_fffffffffffffd78 =
         testing::AssertionResult::failure_message((AssertionResult *)0xceaa4b);
    testing::internal::AssertHelper::AssertHelper
              (this_00,(Type)((ulong)in_stack_fffffffffffffd88 >> 0x20),file,
               (int)((ulong)in_stack_fffffffffffffd78 >> 0x20),(char *)in_stack_fffffffffffffd70);
    testing::internal::AssertHelper::operator=
              (in_stack_fffffffffffffde0,
               (Message *)CONCAT44(in_stack_fffffffffffffddc,in_stack_fffffffffffffdd8));
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffd60);
    testing::Message::~Message((Message *)0xceaaa8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xceab16);
  for (local_1a4 = 0x65; type = (Type)((ulong)in_stack_fffffffffffffd88 >> 0x20), local_1a4 < 200;
      local_1a4 = local_1a4 + 1) {
    in_stack_fffffffffffffd70 =
         (hasher *)
         HashtableTest<google::HashtableInterface_SparseHashSet<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
         ::UniqueObject(in_stack_fffffffffffffd60,(int)in_stack_fffffffffffffd5c);
    local_1b0 = in_stack_fffffffffffffd70;
    google::
    BaseHashtableInterface<google::sparse_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
    ::insert((BaseHashtableInterface<google::sparse_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
              *)CONCAT44(uVar2,in_stack_fffffffffffffea0),in_stack_fffffffffffffe98);
  }
  this_01 = (AssertHelper *)
            google::
            BaseHashtableInterface<google::sparse_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
            ::bucket_count((BaseHashtableInterface<google::sparse_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
                            *)0xceaba6);
  uVar2 = 0x4000;
  testing::internal::EqHelper::Compare<unsigned_long,_unsigned_int,_nullptr>
            (in_stack_fffffffffffffd78,(char *)in_stack_fffffffffffffd70,(unsigned_long *)this_01,
             (uint *)in_stack_fffffffffffffd60);
  line = (int)((ulong)in_stack_fffffffffffffd78 >> 0x20);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_218);
  if (!bVar1) {
    testing::Message::Message((Message *)this_00);
    this_02 = (AssertHelper *)testing::AssertionResult::failure_message((AssertionResult *)0xceac23)
    ;
    testing::internal::AssertHelper::AssertHelper
              (this_00,type,file,line,(char *)in_stack_fffffffffffffd70);
    testing::internal::AssertHelper::operator=
              (this_01,(Message *)CONCAT44(uVar2,in_stack_fffffffffffffdd8));
    testing::internal::AssertHelper::~AssertHelper(this_02);
    testing::Message::~Message((Message *)0xceac71);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xceacd6);
  google::
  HashtableInterface_SparseHashSet<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
  ::~HashtableInterface_SparseHashSet
            ((HashtableInterface_SparseHashSet<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
              *)0xceace3);
  return;
}

Assistant:

TYPED_TEST(HashtableAllTest, ResizeAndRehash) {
  // resize() and rehash() are synonyms.  rehash() is the tr1 name.
  TypeParam ht(10000);
  ht.max_load_factor(0.8f);  // for consistency's sake

  for (int i = 1; i < 100; ++i) ht.insert(this->UniqueObject(i));
  ht.resize(0);
  // Now ht should be as small as possible.
  EXPECT_LT(ht.bucket_count(), 300u);

  ht.rehash(9000);  // use the 'rehash' version of the name.
  // Bucket count should be next power of 2, after considering max_load_factor.
  EXPECT_EQ(16384u, ht.bucket_count());
  for (int i = 101; i < 200; ++i) ht.insert(this->UniqueObject(i));
  // Adding a few hundred buckets shouldn't have caused a resize yet.
  EXPECT_EQ(ht.bucket_count(), 16384u);
}